

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDefaultVertexAttributeTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::DefaultVertexAttributeTests::init
          (DefaultVertexAttributeTests *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  DataType dataType;
  undefined4 uVar2;
  TestContext *pTVar3;
  char *pcVar4;
  Context *pCVar5;
  int extraout_EAX;
  TestNode *pTVar6;
  long *plVar7;
  TestNode *pTVar8;
  undefined8 *puVar9;
  AttributeCase *pAVar10;
  FloatLoader *pFVar11;
  TestNode *pTVar12;
  long *plVar13;
  long lVar14;
  long *local_80;
  long local_70;
  long lStack_68;
  undefined4 *local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined2 uStack_4a;
  TestNode *local_40;
  long local_38;
  
  lVar14 = 0xc;
  local_40 = (TestNode *)this;
  do {
    pTVar6 = (TestNode *)operator_new(0x70);
    pTVar3 = ((TestNode *)this)->m_testCtx;
    pcVar4 = *(char **)((long)&PTR_iterate_0218e930 + lVar14 + 4);
    local_60 = &local_50;
    local_38 = lVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"test with ","");
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_80 = &local_70;
    plVar13 = plVar7 + 2;
    if ((long *)*plVar7 == plVar13) {
      local_70 = *plVar13;
      lStack_68 = plVar7[3];
    }
    else {
      local_70 = *plVar13;
      local_80 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar6,pTVar3,pcVar4,(char *)local_80);
    lVar14 = local_38;
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT26(uStack_4a,CONCAT15(uStack_4b,CONCAT14(uStack_4c,local_50)))
                               + 1);
    }
    cVar1 = *(char *)((long)&init::floatTargets[0].name + lVar14);
    pCVar5 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    dataType = *(DataType *)(&UNK_0218e93c + lVar14);
    pTVar8 = (TestNode *)operator_new(0xb0);
    local_60 = &local_50;
    uStack_4c = 0x20;
    local_50 = 0x74736554;
    local_58 = 5;
    uStack_4b = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_80 = &local_70;
    plVar13 = plVar7 + 2;
    if ((long *)*plVar7 == plVar13) {
      local_70 = *plVar13;
      lStack_68 = plVar7[3];
    }
    else {
      local_70 = *plVar13;
      local_80 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar8,pCVar5->m_testCtx,"vertex_attrib_1f",(char *)local_80);
    pTVar8[1]._vptr_TestNode = (_func_int **)pCVar5;
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_0218eab8;
    *(undefined2 *)&pTVar8[1].m_testCtx = 0x100;
    pTVar8[1].m_name._M_dataplus._M_p = "VertexAttrib1f";
    *(DataType *)&pTVar8[1].m_name._M_string_length = dataType;
    pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar8[1].m_description._M_string_length = 0;
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT26(uStack_4a,CONCAT15(uStack_4b,CONCAT14(uStack_4c,local_50)))
                               + 1);
    }
    puVar9 = (undefined8 *)operator_new(8);
    *puVar9 = &PTR__FloatLoader_0218eb08;
    *(undefined8 **)&pTVar8[1].m_name.field_2 = puVar9;
    tcu::TestNode::addChild(pTVar6,pTVar8);
    pCVar5 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    if (cVar1 == '\0') {
      pTVar8 = (TestNode *)operator_new(0xb0);
      local_60 = &local_50;
      uStack_4c = 0x20;
      local_50 = 0x74736554;
      local_58 = 5;
      uStack_4b = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
      local_80 = &local_70;
      plVar13 = plVar7 + 2;
      if ((long *)*plVar7 == plVar13) {
        local_70 = *plVar13;
        lStack_68 = plVar7[3];
      }
      else {
        local_70 = *plVar13;
        local_80 = (long *)*plVar7;
      }
      *plVar7 = (long)plVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar8,pCVar5->m_testCtx,"vertex_attrib_2f",(char *)local_80);
      pTVar8[1]._vptr_TestNode = (_func_int **)pCVar5;
      pTVar8->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_0218eab8;
      *(undefined2 *)&pTVar8[1].m_testCtx = 0x100;
      pTVar8[1].m_name._M_dataplus._M_p = "VertexAttrib2f";
      *(DataType *)&pTVar8[1].m_name._M_string_length = dataType;
      pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0;
      *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 0;
      *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
      *(undefined4 *)&pTVar8[1].m_description._M_string_length = 0;
      if (local_80 != &local_70) {
        operator_delete(local_80,local_70 + 1);
      }
      if (local_60 != &local_50) {
        operator_delete(local_60,CONCAT26(uStack_4a,CONCAT15(uStack_4b,CONCAT14(uStack_4c,local_50))
                                         ) + 1);
      }
      puVar9 = (undefined8 *)operator_new(8);
      *puVar9 = &PTR__FloatLoader_0218eb58;
      *(undefined8 **)&pTVar8[1].m_name.field_2 = puVar9;
      tcu::TestNode::addChild(pTVar6,pTVar8);
      pCVar5 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      pTVar8 = (TestNode *)operator_new(0xb0);
      local_60 = &local_50;
      uStack_4c = 0x20;
      local_50 = 0x74736554;
      local_58 = 5;
      uStack_4b = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
      local_80 = &local_70;
      plVar13 = plVar7 + 2;
      if ((long *)*plVar7 == plVar13) {
        local_70 = *plVar13;
        lStack_68 = plVar7[3];
      }
      else {
        local_70 = *plVar13;
        local_80 = (long *)*plVar7;
      }
      *plVar7 = (long)plVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar8,pCVar5->m_testCtx,"vertex_attrib_3f",(char *)local_80);
      pTVar8[1]._vptr_TestNode = (_func_int **)pCVar5;
      pTVar8->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_0218eab8;
      *(undefined2 *)&pTVar8[1].m_testCtx = 0x100;
      pTVar8[1].m_name._M_dataplus._M_p = "VertexAttrib3f";
      *(DataType *)&pTVar8[1].m_name._M_string_length = dataType;
      pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0;
      *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 0;
      *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
      *(undefined4 *)&pTVar8[1].m_description._M_string_length = 0;
      if (local_80 != &local_70) {
        operator_delete(local_80,local_70 + 1);
      }
      if (local_60 != &local_50) {
        operator_delete(local_60,CONCAT26(uStack_4a,CONCAT15(uStack_4b,CONCAT14(uStack_4c,local_50))
                                         ) + 1);
      }
      puVar9 = (undefined8 *)operator_new(8);
      *puVar9 = &PTR__FloatLoader_0218eb98;
      *(undefined8 **)&pTVar8[1].m_name.field_2 = puVar9;
      tcu::TestNode::addChild(pTVar6,pTVar8);
      pAVar10 = anon_unknown_1::AttributeCase::
                create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib4f>
                          ((Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,dataType);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pAVar10);
      pAVar10 = anon_unknown_1::AttributeCase::
                create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib1fv>
                          ((Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,dataType);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pAVar10);
      pCVar5 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      pAVar10 = (AttributeCase *)operator_new(0xb0);
      local_60 = &local_50;
      uStack_4c = 0x20;
      local_50 = 0x74736554;
      local_58 = 5;
      uStack_4b = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
      local_80 = &local_70;
      plVar13 = plVar7 + 2;
      if ((long *)*plVar7 == plVar13) {
        local_70 = *plVar13;
        lStack_68 = plVar7[3];
      }
      else {
        local_70 = *plVar13;
        local_80 = (long *)*plVar7;
      }
      *plVar7 = (long)plVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pAVar10,pCVar5->m_testCtx,"vertex_attrib_2fv",(char *)local_80);
      (pAVar10->super_TestCase).m_context = pCVar5;
      (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__AttributeCase_0218eab8;
      pAVar10->m_normalizing = false;
      pAVar10->m_useNegativeValues = true;
      pAVar10->m_funcName = "VertexAttrib2fv";
      pAVar10->m_dataType = dataType;
      pAVar10->m_loader = (FloatLoader *)0x0;
      pAVar10->m_program = (ShaderProgram *)0x0;
      pAVar10->m_bufID = 0;
      pAVar10->m_allIterationsPassed = true;
      pAVar10->m_iteration = 0;
      if (local_80 != &local_70) {
        operator_delete(local_80,local_70 + 1);
      }
      if (local_60 != &local_50) {
        operator_delete(local_60,CONCAT26(uStack_4a,CONCAT15(uStack_4b,CONCAT14(uStack_4c,local_50))
                                         ) + 1);
      }
      pFVar11 = (FloatLoader *)operator_new(8);
      pFVar11->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_0218ec58;
      pAVar10->m_loader = pFVar11;
    }
    else {
      pAVar10 = anon_unknown_1::AttributeCase::
                create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib4f>
                          (pCVar5,dataType);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pAVar10);
      pAVar10 = anon_unknown_1::AttributeCase::
                create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib1fv>
                          ((Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,dataType);
    }
    tcu::TestNode::addChild(pTVar6,(TestNode *)pAVar10);
    if (cVar1 == '\0') {
      pCVar5 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      pTVar8 = (TestNode *)operator_new(0xb0);
      local_60 = &local_50;
      uStack_4c = 0x20;
      local_50 = 0x74736554;
      local_58 = 5;
      uStack_4b = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
      local_80 = &local_70;
      plVar13 = plVar7 + 2;
      if ((long *)*plVar7 == plVar13) {
        local_70 = *plVar13;
        lStack_68 = plVar7[3];
      }
      else {
        local_70 = *plVar13;
        local_80 = (long *)*plVar7;
      }
      *plVar7 = (long)plVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar8,pCVar5->m_testCtx,"vertex_attrib_3fv",(char *)local_80);
      pTVar8[1]._vptr_TestNode = (_func_int **)pCVar5;
      pTVar8->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_0218eab8;
      *(undefined2 *)&pTVar8[1].m_testCtx = 0x100;
      pTVar8[1].m_name._M_dataplus._M_p = "VertexAttrib3fv";
      *(DataType *)&pTVar8[1].m_name._M_string_length = dataType;
      pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0;
      *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 0;
      *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
      *(undefined4 *)&pTVar8[1].m_description._M_string_length = 0;
      if (local_80 != &local_70) {
        operator_delete(local_80,local_70 + 1);
      }
      if (local_60 != &local_50) {
        operator_delete(local_60,CONCAT26(uStack_4a,CONCAT15(uStack_4b,CONCAT14(uStack_4c,local_50))
                                         ) + 1);
      }
      puVar9 = (undefined8 *)operator_new(8);
      *puVar9 = &PTR__FloatLoader_0218ec98;
      *(undefined8 **)&pTVar8[1].m_name.field_2 = puVar9;
      tcu::TestNode::addChild(pTVar6,pTVar8);
    }
    pCVar5 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    pTVar8 = (TestNode *)operator_new(0xb0);
    local_60 = &local_50;
    uStack_4c = 0x20;
    local_50 = 0x74736554;
    local_58 = 5;
    uStack_4b = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_80 = &local_70;
    plVar13 = plVar7 + 2;
    if ((long *)*plVar7 == plVar13) {
      local_70 = *plVar13;
      lStack_68 = plVar7[3];
    }
    else {
      local_70 = *plVar13;
      local_80 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar8,pCVar5->m_testCtx,"vertex_attrib_4fv",(char *)local_80);
    pTVar8[1]._vptr_TestNode = (_func_int **)pCVar5;
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_0218eab8;
    *(undefined2 *)&pTVar8[1].m_testCtx = 0x100;
    pTVar8[1].m_name._M_dataplus._M_p = "VertexAttrib4fv";
    *(DataType *)&pTVar8[1].m_name._M_string_length = dataType;
    pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar8[1].m_description._M_string_length = 0;
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    lVar14 = local_38;
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT26(uStack_4a,CONCAT15(uStack_4b,CONCAT14(uStack_4c,local_50)))
                               + 1);
    }
    puVar9 = (undefined8 *)operator_new(8);
    *puVar9 = &PTR__FloatLoader_0218ecd8;
    *(undefined8 **)&pTVar8[1].m_name.field_2 = puVar9;
    tcu::TestNode::addChild(pTVar6,pTVar8);
    this = (DefaultVertexAttributeTests *)local_40;
    tcu::TestNode::addChild(local_40,pTVar6);
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0xdc);
  lVar14 = 0;
  do {
    pTVar6 = (TestNode *)operator_new(0x70);
    pTVar3 = ((TestNode *)this)->m_testCtx;
    pcVar4 = *(char **)((long)&init::intTargets[0].name + lVar14);
    local_60 = &local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"test with ","");
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
    plVar13 = plVar7 + 2;
    if ((long *)*plVar7 == plVar13) {
      local_70 = *plVar13;
      lStack_68 = plVar7[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar13;
      local_80 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar6,pTVar3,pcVar4,(char *)local_80);
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    pTVar8 = local_40;
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT26(uStack_4a,CONCAT15(uStack_4b,CONCAT14(uStack_4c,local_50)))
                               + 1);
    }
    pCVar5 = (Context *)pTVar8[1]._vptr_TestNode;
    uVar2 = *(undefined4 *)((long)&init::intTargets[0].dataType + lVar14);
    pTVar12 = (TestNode *)operator_new(0xb0);
    local_60 = &local_50;
    uStack_4c = 0x20;
    local_50 = 0x74736554;
    local_58 = 5;
    uStack_4b = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_80 = &local_70;
    plVar13 = plVar7 + 2;
    if ((long *)*plVar7 == plVar13) {
      local_70 = *plVar13;
      lStack_68 = plVar7[3];
    }
    else {
      local_70 = *plVar13;
      local_80 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar12,pCVar5->m_testCtx,"vertex_attribi_4i",(char *)local_80);
    pTVar12[1]._vptr_TestNode = (_func_int **)pCVar5;
    pTVar12->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_0218eab8;
    *(undefined2 *)&pTVar12[1].m_testCtx = 0x100;
    pTVar12[1].m_name._M_dataplus._M_p = "VertexAttrib4i";
    *(undefined4 *)&pTVar12[1].m_name._M_string_length = uVar2;
    pTVar12[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar12[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar12[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar12[1].m_description._M_string_length = 0;
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT26(uStack_4a,CONCAT15(uStack_4b,CONCAT14(uStack_4c,local_50)))
                               + 1);
    }
    puVar9 = (undefined8 *)operator_new(8);
    *puVar9 = &PTR__FloatLoader_0218ed18;
    *(undefined8 **)&pTVar12[1].m_name.field_2 = puVar9;
    tcu::TestNode::addChild(pTVar6,pTVar12);
    pCVar5 = (Context *)pTVar8[1]._vptr_TestNode;
    pTVar8 = (TestNode *)operator_new(0xb0);
    local_60 = &local_50;
    uStack_4c = 0x20;
    local_50 = 0x74736554;
    local_58 = 5;
    uStack_4b = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_80 = &local_70;
    plVar13 = plVar7 + 2;
    if ((long *)*plVar7 == plVar13) {
      local_70 = *plVar13;
      lStack_68 = plVar7[3];
    }
    else {
      local_70 = *plVar13;
      local_80 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar8,pCVar5->m_testCtx,"vertex_attribi_4iv",(char *)local_80);
    pTVar8[1]._vptr_TestNode = (_func_int **)pCVar5;
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_0218eab8;
    *(undefined2 *)&pTVar8[1].m_testCtx = 0x100;
    pTVar8[1].m_name._M_dataplus._M_p = "VertexAttrib4iv";
    *(undefined4 *)&pTVar8[1].m_name._M_string_length = uVar2;
    pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar8[1].m_description._M_string_length = 0;
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT26(uStack_4a,CONCAT15(uStack_4b,CONCAT14(uStack_4c,local_50)))
                               + 1);
    }
    puVar9 = (undefined8 *)operator_new(8);
    *puVar9 = &PTR__FloatLoader_0218ed58;
    *(undefined8 **)&pTVar8[1].m_name.field_2 = puVar9;
    tcu::TestNode::addChild(pTVar6,pTVar8);
    this = (DefaultVertexAttributeTests *)local_40;
    tcu::TestNode::addChild(local_40,pTVar6);
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x40);
  lVar14 = 0;
  do {
    pTVar6 = (TestNode *)operator_new(0x70);
    pTVar3 = ((TestNode *)this)->m_testCtx;
    pcVar4 = *(char **)((long)&init::uintTargets[0].name + lVar14);
    local_60 = &local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"test with ","");
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
    plVar13 = plVar7 + 2;
    if ((long *)*plVar7 == plVar13) {
      local_70 = *plVar13;
      lStack_68 = plVar7[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar13;
      local_80 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar6,pTVar3,pcVar4,(char *)local_80);
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    pTVar8 = local_40;
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT26(uStack_4a,CONCAT15(uStack_4b,CONCAT14(uStack_4c,local_50)))
                               + 1);
    }
    pCVar5 = (Context *)pTVar8[1]._vptr_TestNode;
    uVar2 = *(undefined4 *)((long)&init::uintTargets[0].dataType + lVar14);
    pTVar12 = (TestNode *)operator_new(0xb0);
    local_60 = &local_50;
    uStack_4c = 0x20;
    local_50 = 0x74736554;
    local_58 = 5;
    uStack_4b = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_80 = &local_70;
    plVar13 = plVar7 + 2;
    if ((long *)*plVar7 == plVar13) {
      local_70 = *plVar13;
      lStack_68 = plVar7[3];
    }
    else {
      local_70 = *plVar13;
      local_80 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar12,pCVar5->m_testCtx,"vertex_attribi_4ui",(char *)local_80);
    pTVar12[1]._vptr_TestNode = (_func_int **)pCVar5;
    pTVar12->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_0218eab8;
    *(undefined2 *)&pTVar12[1].m_testCtx = 0;
    pTVar12[1].m_name._M_dataplus._M_p = "VertexAttrib4ui";
    *(undefined4 *)&pTVar12[1].m_name._M_string_length = uVar2;
    pTVar12[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar12[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar12[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar12[1].m_description._M_string_length = 0;
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT26(uStack_4a,CONCAT15(uStack_4b,CONCAT14(uStack_4c,local_50)))
                               + 1);
    }
    puVar9 = (undefined8 *)operator_new(8);
    *puVar9 = &PTR__FloatLoader_0218ed98;
    *(undefined8 **)&pTVar12[1].m_name.field_2 = puVar9;
    tcu::TestNode::addChild(pTVar6,pTVar12);
    pCVar5 = (Context *)pTVar8[1]._vptr_TestNode;
    pTVar8 = (TestNode *)operator_new(0xb0);
    local_60 = &local_50;
    uStack_4c = 0x20;
    local_50 = 0x74736554;
    local_58 = 5;
    uStack_4b = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_80 = &local_70;
    plVar13 = plVar7 + 2;
    if ((long *)*plVar7 == plVar13) {
      local_70 = *plVar13;
      lStack_68 = plVar7[3];
    }
    else {
      local_70 = *plVar13;
      local_80 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar8,pCVar5->m_testCtx,"vertex_attribi_4uiv",(char *)local_80);
    pTVar8[1]._vptr_TestNode = (_func_int **)pCVar5;
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_0218eab8;
    *(undefined2 *)&pTVar8[1].m_testCtx = 0;
    pTVar8[1].m_name._M_dataplus._M_p = "VertexAttrib4uiv";
    *(undefined4 *)&pTVar8[1].m_name._M_string_length = uVar2;
    pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar8[1].m_description._M_string_length = 0;
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT26(uStack_4a,CONCAT15(uStack_4b,CONCAT14(uStack_4c,local_50)))
                               + 1);
    }
    puVar9 = (undefined8 *)operator_new(8);
    *puVar9 = &PTR__FloatLoader_0218edd8;
    *(undefined8 **)&pTVar8[1].m_name.field_2 = puVar9;
    tcu::TestNode::addChild(pTVar6,pTVar8);
    this = (DefaultVertexAttributeTests *)local_40;
    tcu::TestNode::addChild(local_40,pTVar6);
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x40);
  return extraout_EAX;
}

Assistant:

void DefaultVertexAttributeTests::init (void)
{
	struct Target
	{
		const char*		name;
		glu::DataType	dataType;
		bool			reducedTestSets;	// !< use reduced coverage
	};

	static const Target floatTargets[] =
	{
		{ "float",	glu::TYPE_FLOAT,		false	},
		{ "vec2",	glu::TYPE_FLOAT_VEC2,	true	},
		{ "vec3",	glu::TYPE_FLOAT_VEC3,	true	},
		{ "vec4",	glu::TYPE_FLOAT_VEC4,	false	},
		{ "mat2",	glu::TYPE_FLOAT_MAT2,	true	},
		{ "mat2x3",	glu::TYPE_FLOAT_MAT2X3,	true	},
		{ "mat2x4",	glu::TYPE_FLOAT_MAT2X4,	true	},
		{ "mat3",	glu::TYPE_FLOAT_MAT3,	true	},
		{ "mat3x2",	glu::TYPE_FLOAT_MAT3X2,	true	},
		{ "mat3x4",	glu::TYPE_FLOAT_MAT3X4,	true	},
		{ "mat4",	glu::TYPE_FLOAT_MAT4,	false	},
		{ "mat4x2",	glu::TYPE_FLOAT_MAT4X2,	true	},
		{ "mat4x3",	glu::TYPE_FLOAT_MAT4X3,	true	},
	};

	static const Target intTargets[] =
	{
		{ "int",	glu::TYPE_INT,			false	},
		{ "ivec2",	glu::TYPE_INT_VEC2,		true	},
		{ "ivec3",	glu::TYPE_INT_VEC3,		true	},
		{ "ivec4",	glu::TYPE_INT_VEC4,		false	},
	};

	static const Target uintTargets[] =
	{
		{ "uint",	glu::TYPE_UINT,			false	},
		{ "uvec2",	glu::TYPE_UINT_VEC2,	true	},
		{ "uvec3",	glu::TYPE_UINT_VEC3,	true	},
		{ "uvec4",	glu::TYPE_UINT_VEC4,	false	},
	};

	// float targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(floatTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, floatTargets[targetNdx].name, (std::string("test with ") + floatTargets[targetNdx].name).c_str());
		const bool					fullSet	= !floatTargets[targetNdx].reducedTestSets;

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, floatTargets[targetNdx].dataType))
#define ADD_REDUCED_CASE(X)	if (fullSet) ADD_CASE(X)

		ADD_CASE		(LoaderVertexAttrib1f);
		ADD_REDUCED_CASE(LoaderVertexAttrib2f);
		ADD_REDUCED_CASE(LoaderVertexAttrib3f);
		ADD_CASE		(LoaderVertexAttrib4f);

		ADD_CASE		(LoaderVertexAttrib1fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib2fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib3fv);
		ADD_CASE		(LoaderVertexAttrib4fv);

#undef ADD_CASE
#undef ADD_REDUCED_CASE

		addChild(group);
	}

	// int targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(intTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, intTargets[targetNdx].name, (std::string("test with ") + intTargets[targetNdx].name).c_str());

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, intTargets[targetNdx].dataType))

		ADD_CASE		(LoaderVertexAttribI4i);
		ADD_CASE		(LoaderVertexAttribI4iv);

#undef ADD_CASE

		addChild(group);
	}

	// uint targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(uintTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, uintTargets[targetNdx].name, (std::string("test with ") + uintTargets[targetNdx].name).c_str());

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, uintTargets[targetNdx].dataType))

		ADD_CASE		(LoaderVertexAttribI4ui);
		ADD_CASE		(LoaderVertexAttribI4uiv);

#undef ADD_CASE

		addChild(group);
	}
}